

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Architecture.cpp
# Opt level: O2

void __thiscall ArchitectureCommand::writeTempData(ArchitectureCommand *this,TempData *tempData)

{
  istream *piVar1;
  string line;
  stringstream stream;
  
  if ((this->tempText)._M_string_length != 0) {
    std::__cxx11::stringstream::stringstream
              ((stringstream *)&stream,(string *)&this->tempText,_S_out|_S_in);
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    while( true ) {
      piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&stream,(string *)&line,'\n');
      if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
      if (line._M_string_length != 0) {
        TempData::writeLine(tempData,this->position,&line);
      }
    }
    std::__cxx11::string::~string((string *)&line);
    std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  }
  return;
}

Assistant:

void ArchitectureCommand::writeTempData(TempData& tempData) const
{
	if (tempText.size() != 0)
	{
		std::stringstream stream(tempText);

		std::string line;
		while (std::getline(stream,line,'\n'))
		{
			if (line.size() != 0)
				tempData.writeLine(position,line);
		}
	}
}